

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_c382::ktxTexture1_LoadImageDataTest_LoadImageDataExternal_Test::
~ktxTexture1_LoadImageDataTest_LoadImageDataExternal_Test
          (ktxTexture1_LoadImageDataTest_LoadImageDataExternal_Test *this)

{
  ktxTextureTestBase<unsigned_char,_4U,_32856U>::~ktxTextureTestBase
            ((ktxTextureTestBase<unsigned_char,_4U,_32856U> *)this);
  operator_delete(this,0x1e0);
  return;
}

Assistant:

TEST_F(ktxTexture1_LoadImageDataTest, LoadImageDataExternal) {
    ktxTexture* texture = 0;
    KTX_error_code result;
    ktx_uint8_t* buf;

    if (ktxMemFile != NULL) {
        result = ktxTexture_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                             0,
                                             &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        buf = new ktx_uint8_t[paddedImageDataSize];
        EXPECT_EQ(ktxTexture_LoadImageData(texture, buf, paddedImageDataSize),
                  KTX_SUCCESS);
        EXPECT_EQ(paddedImageDataSize, ktxTexture_GetDataSize(texture));
        EXPECT_EQ(helper.compareTexture1Images(buf), true);
        if (texture)
            ktxTexture_Destroy(texture);
        delete[] buf;
    }
}